

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_render_pass_dependencies
          (Impl *this,Value *dependencies,VkSubpassDependency **out_deps)

{
  SizeType SVar1;
  VkSubpassDependency *pVVar2;
  ConstValueIterator pGVar3;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *obj
  ;
  ConstValueIterator itr;
  VkSubpassDependency *ret;
  VkSubpassDependency *infos;
  VkSubpassDependency **out_deps_local;
  Value *dependencies_local;
  Impl *this_local;
  
  SVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size(dependencies);
  pVVar2 = ScratchAllocator::allocate_n_cleared<VkSubpassDependency>(&this->allocator,(ulong)SVar1);
  obj = rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::Begin(dependencies);
  ret = pVVar2;
  while( true ) {
    pGVar3 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::End(dependencies);
    if (obj == pGVar3) break;
    parse_render_pass_dependencies_base<VkSubpassDependency>(ret,obj);
    obj = obj + 1;
    ret = ret + 1;
  }
  *out_deps = pVVar2;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_render_pass_dependencies(const Value &dependencies, const VkSubpassDependency **out_deps)
{
	auto *infos = allocator.allocate_n_cleared<VkSubpassDependency>(dependencies.Size());
	auto *ret = infos;

	for (auto itr = dependencies.Begin(); itr != dependencies.End(); ++itr, infos++)
	{
		auto &obj = *itr;
		parse_render_pass_dependencies_base(*infos, obj);
	}

	*out_deps = ret;
	return true;
}